

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>::
Data(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
     *this,Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
           *other)

{
  uchar *puVar1;
  Span *pSVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> *pNVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  R RVar13;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar11 = other->numBuckets;
  sVar12 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar12;
  this->spans = (Span *)0x0;
  RVar13 = allocateSpans(sVar11);
  this->spans = (Span *)RVar13.spans;
  if (RVar13.nSpans != 0) {
    lVar10 = 0;
    sVar11 = 0;
    do {
      pSVar2 = other->spans;
      sVar12 = 0;
      do {
        uVar8 = (ulong)pSVar2->offsets[sVar12 + lVar10];
        if (uVar8 != 0xff) {
          pEVar3 = pSVar2[sVar11].entries;
          pNVar9 = Span<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                   ::insert(this->spans + sVar11,sVar12);
          uVar4 = *(undefined8 *)pEVar3[uVar8].storage.data;
          uVar5 = *(undefined8 *)(pEVar3[uVar8].storage.data + 8);
          puVar1 = pEVar3[uVar8].storage.data + 0x10;
          uVar6 = *(undefined8 *)puVar1;
          uVar7 = *(undefined8 *)(puVar1 + 8);
          (pNVar9->key).glyph = (int)uVar4;
          (pNVar9->key).subPixelPosition.x = (QFixed)(int)((ulong)uVar4 >> 0x20);
          *(undefined8 *)&(pNVar9->key).subPixelPosition.y = uVar5;
          (pNVar9->value).y = (int)uVar6;
          (pNVar9->value).w = (int)((ulong)uVar6 >> 0x20);
          (pNVar9->value).h = (int)uVar7;
          (pNVar9->value).baseLineX = (int)((ulong)uVar7 >> 0x20);
          (pNVar9->value).baseLineY = *(int *)(pEVar3[uVar8].storage.data + 0x20);
        }
        sVar12 = sVar12 + 1;
      } while (sVar12 != 0x80);
      sVar11 = sVar11 + 1;
      lVar10 = lVar10 + 0x90;
    } while (sVar11 != RVar13.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }